

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void list_client_accounts(int client_id)

{
  long *plVar1;
  Account account;
  ifstream inFile;
  byte abStack_208 [488];
  
  account._vptr_Account = (_func_int **)&PTR_create_account_00107c88;
  std::ifstream::ifstream(&inFile);
  std::ifstream::open((char *)&inFile,0x10513d);
  if ((abStack_208[*(long *)(_inFile + -0x18)] & 5) == 0) {
    std::operator<<((ostream *)&std::cout,"\n\n\t\tACCOUNT HOLDER LIST\n\n");
    std::operator<<((ostream *)&std::cout,
                    "Account no.\t\tClient id\t\t\t\tClient Class\t\t\t\tAccount Type\t\t     Balance\n\n"
                   );
    while( true ) {
      plVar1 = (long *)std::istream::read((char *)&inFile,(long)&account);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
      if (account.client_id == client_id) {
        Account::account_data_in_tabular_format(&account);
      }
    }
    std::ifstream::close();
  }
  else {
    std::operator<<((ostream *)&std::cout,"File could not be open !! Press any Key...");
  }
  std::ifstream::~ifstream(&inFile);
  return;
}

Assistant:

void list_client_accounts(int client_id)
{
    /*!
     * It is a helper function that helps to show the list of accounts
     * that's owned by the client and created in the banking system.
     * To do that it reads data from Account.dat and it uses
     * Account.get_client_id & Account::account_data_in_tabular_format
     * to accomplish its task
     */
    Account account;
    std::ifstream inFile;
    inFile.open("Account.dat",std::ios::binary);
    if(!inFile)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    std::cout<<"\n\n\t\tACCOUNT HOLDER LIST\n\n";

    std::cout<<"Account no.\t\tClient id\t\t\t\tClient Class\t\t\t\tAccount Type\t\t     Balance\n\n";

    while(inFile.read((char *) &account, sizeof(Account)))
    {
        if (account.get_client_id() == client_id){
            account.account_data_in_tabular_format();
        }

    }
    inFile.close();
}